

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

string * __thiscall
fasttext::Args::metricToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,metric_name mn)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(mn) {
  case f1score:
    pcVar2 = "f1score";
    pcVar1 = "";
    break;
  case f1scoreLabel:
    pcVar2 = "f1scoreLabel";
    pcVar1 = "";
    break;
  case precisionAtRecall:
    pcVar2 = "precisionAtRecall";
    pcVar1 = "";
    break;
  case precisionAtRecallLabel:
    pcVar2 = "precisionAtRecallLabel";
    pcVar1 = "";
    break;
  case recallAtPrecision:
    pcVar2 = "recallAtPrecision";
    pcVar1 = "";
    break;
  case recallAtPrecisionLabel:
    pcVar2 = "recallAtPrecisionLabel";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown metric name!";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::metricToString(metric_name mn) const {
  switch (mn) {
    case metric_name::f1score:
      return "f1score";
    case metric_name::f1scoreLabel:
      return "f1scoreLabel";
    case metric_name::precisionAtRecall:
      return "precisionAtRecall";
    case metric_name::precisionAtRecallLabel:
      return "precisionAtRecallLabel";
    case metric_name::recallAtPrecision:
      return "recallAtPrecision";
    case metric_name::recallAtPrecisionLabel:
      return "recallAtPrecisionLabel";
  }
  return "Unknown metric name!"; // should never happen
}